

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cpp
# Opt level: O2

int mbedtls_mpi_cmp_mpi(mbedtls_mpi *X,mbedtls_mpi *Y)

{
  short sVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  bool bVar6;
  
  uVar2 = (ulong)X->n;
  do {
    uVar4 = uVar2;
    if (uVar4 == 0) break;
    uVar2 = uVar4 - 1;
  } while (X->p[uVar4 - 1] == 0);
  uVar2 = (ulong)Y->n;
  do {
    uVar3 = uVar2;
    if (uVar3 == 0) break;
    uVar2 = uVar3 - 1;
  } while (Y->p[uVar3 - 1] == 0);
  iVar5 = 0;
  if (uVar3 != 0 || uVar4 != 0) {
    if (uVar3 < uVar4) {
      return (int)X->s;
    }
    if (uVar4 < uVar3) {
      return -(int)Y->s;
    }
    sVar1 = X->s;
    if (sVar1 < 1) {
      if (sVar1 != 0 && 0 < Y->s) {
        return -1;
      }
    }
    else if (Y->s < 0) {
      return 1;
    }
    do {
      bVar6 = uVar4 == 0;
      uVar4 = uVar4 - 1;
      if (bVar6) {
        return 0;
      }
      if (Y->p[uVar4] < X->p[uVar4]) {
        return (int)sVar1;
      }
    } while (Y->p[uVar4] <= X->p[uVar4]);
    iVar5 = -(int)sVar1;
  }
  return iVar5;
}

Assistant:

int mbedtls_mpi_cmp_mpi(const mbedtls_mpi *X, const mbedtls_mpi *Y)
{
    size_t i, j;

    for (i = X->n; i > 0; i--) {
        if (X->p[i - 1] != 0) {
            break;
        }
    }

    for (j = Y->n; j > 0; j--) {
        if (Y->p[j - 1] != 0) {
            break;
        }
    }

    if (i == 0 && j == 0) {
        return 0;
    }

    if (i > j) {
        return X->s;
    }
    if (j > i) {
        return -Y->s;
    }

    if (X->s > 0 && Y->s < 0) {
        return 1;
    }
    if (Y->s > 0 && X->s < 0) {
        return -1;
    }

    for (; i > 0; i--) {
        if (X->p[i - 1] > Y->p[i - 1]) {
            return X->s;
        }
        if (X->p[i - 1] < Y->p[i - 1]) {
            return -X->s;
        }
    }

    return 0;
}